

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merl.cpp
# Opt level: O0

void renderViewer(double cpuDt,double gpuDt)

{
  bool bVar1;
  reference ppcVar2;
  size_type sVar3;
  ImDrawData *draw_data;
  char local_948 [8];
  char path [1024];
  char name [64];
  char *brdfModes [3];
  char *local_4e8;
  char *shadingModes [4];
  ImVec2 local_4c0;
  ImVec2 local_4b8;
  ImVec2 local_4b0;
  ImVec2 local_4a8;
  ImVec2 local_4a0;
  ImVec2 local_498;
  ImVec2 local_490;
  char local_488 [8];
  char buf [1024];
  ImVec2 local_80;
  ImVec2 local_78;
  ImVec2 local_70;
  ImVec2 local_68;
  ImVec2 local_60;
  char *local_58;
  char *aaItems [5];
  ImVec2 local_28;
  ImVec2 local_20;
  double local_18;
  double gpuDt_local;
  double cpuDt_local;
  
  local_18 = gpuDt;
  gpuDt_local = cpuDt;
  (*glad_glBindFramebuffer)(0x8ca9,g_gl.framebuffers[0]);
  (*glad_glBindFramebuffer)(0x8ca8,g_gl.framebuffers[1]);
  (*glad_glViewport)(0,0,g_app.viewer.w,g_app.viewer.h);
  (*glad_glClearColor)(0.0,0.0,0.0,0.0);
  (*glad_glClear)(0x4000);
  (*glad_glUseProgram)(g_gl.programs[0]);
  (*glad_glBindVertexArray)(g_gl.vertexArrays[0]);
  (*glad_glDrawArrays)(5,0,4);
  if ((g_app.viewer.hud & 1U) != 0) {
    ImGui_ImplGlfwGL3_NewFrame();
    ImVec2::ImVec2(&local_20,270.0,10.0);
    ImVec2::ImVec2(&local_28,0.0,0.0);
    ImGui::SetNextWindowPos(&local_20,0,&local_28);
    ImVec2::ImVec2((ImVec2 *)(aaItems + 4),250.0,120.0);
    ImGui::SetNextWindowSize((ImVec2 *)(aaItems + 4),0);
    ImGui::Begin("Framebuffer",(bool *)0x0,0);
    memcpy(&local_58,&DAT_002745b0,0x28);
    bVar1 = ImGui::Combo("AA",&g_framebuffer.aa,&local_58,5,-1);
    if (bVar1) {
      imguiSetAa();
    }
    bVar1 = ImGui::Combo("MSAA",&g_framebuffer.msaa.fixed,"Fixed",-1);
    if (bVar1) {
      imguiSetAa();
    }
    ImGui::Checkbox("Progressive",&g_framebuffer.flags.progressive);
    if ((g_framebuffer.flags.progressive & 1U) != 0) {
      ImGui::SameLine(0.0,-1.0);
      ImVec2::ImVec2(&local_60,0.0,0.0);
      bVar1 = ImGui::Button("Reset",&local_60);
      if (bVar1) {
        g_framebuffer.flags.reset = true;
      }
    }
    ImGui::End();
    ImVec2::ImVec2(&local_68,530.0,10.0);
    ImVec2::ImVec2(&local_70,0.0,0.0);
    ImGui::SetNextWindowPos(&local_68,0,&local_70);
    ImVec2::ImVec2(&local_78,250.0,120.0);
    ImGui::SetNextWindowSize(&local_78,0);
    ImGui::Begin("Viewer",(bool *)0x0,0);
    bVar1 = ImGui::SliderFloat("Exposure",&g_app.viewer.exposure,-3.0,3.0,"%.3f",1.0);
    if (bVar1) {
      configureViewerProgram();
    }
    bVar1 = ImGui::SliderFloat("Gamma",&g_app.viewer.gamma,1.0,4.0,"%.3f",1.0);
    if (bVar1) {
      configureViewerProgram();
    }
    ImVec2::ImVec2(&local_80,0.0,0.0);
    bVar1 = ImGui::Button("Take Screenshot",&local_80);
    if (bVar1) {
      snprintf(local_488,0x400,"screenshot%03i",(ulong)(uint)renderViewer::cnt);
      (*glad_glBindFramebuffer)(0x8ca8,0);
      djgt_save_glcolorbuffer_png(0x404,0x1908,local_488);
      renderViewer::cnt = renderViewer::cnt + 1;
    }
    ImVec2::ImVec2(&local_490,0.0,0.0);
    bVar1 = ImGui::Button("Record",&local_490);
    if (bVar1) {
      g_app.recorder.on = (int)((g_app.recorder.on != 0 ^ 0xffU) & 1);
    }
    if (g_app.recorder.on != 0) {
      ImGui::SameLine(0.0,-1.0);
      ImGui::Text("Recording...");
    }
    ImGui::End();
    ImVec2::ImVec2(&local_498,10.0,10.0);
    ImVec2::ImVec2(&local_4a0,0.0,0.0);
    ImGui::SetNextWindowPos(&local_498,0,&local_4a0);
    ImVec2::ImVec2(&local_4a8,250.0,120.0);
    ImGui::SetNextWindowSize(&local_4a8,0);
    ImGui::Begin("Camera",(bool *)0x0,0);
    bVar1 = ImGui::SliderFloat("FOVY",&g_camera.fovy,1.0,179.0,"%.3f",1.0);
    if (bVar1) {
      g_framebuffer.flags.reset = true;
    }
    bVar1 = ImGui::SliderFloat("zNear",&g_camera.zNear,0.01,100.0,"%.3f",1.0);
    if ((bVar1) && (g_camera.zFar <= g_camera.zNear)) {
      g_camera.zNear = g_camera.zFar - 0.01;
    }
    bVar1 = ImGui::SliderFloat("zFar",&g_camera.zFar,1.0,1500.0,"%.3f",1.0);
    if ((bVar1) && (g_camera.zFar <= g_camera.zNear)) {
      g_camera.zFar = g_camera.zNear + 0.01;
    }
    ImGui::End();
    ImVec2::ImVec2(&local_4b0,10.0,140.0);
    ImVec2::ImVec2(&local_4b8,0.0,0.0);
    ImGui::SetNextWindowPos(&local_4b0,0,&local_4b8);
    ImVec2::ImVec2(&local_4c0,250.0,450.0);
    ImGui::SetNextWindowSize(&local_4c0,0);
    ImGui::Begin("Sphere",(bool *)0x0,0);
    local_4e8 = "MC Cos";
    shadingModes[0] = "MC GGX";
    shadingModes[1] = "MC MIS";
    shadingModes[2] = "Debug";
    name._56_8_ = anon_var_dwarf_146d2;
    bVar1 = ImGui::Combo("Shading",&g_sphere.shading.mode,&local_4e8,4,-1);
    if (bVar1) {
      loadSphereProgram();
      loadMerlTexture();
      g_framebuffer.flags.reset = true;
    }
    bVar1 = ImGui::Combo("Brdf",&g_sphere.shading.brdf,(char **)(name + 0x38),3,-1);
    if (bVar1) {
      loadSphereProgram();
      g_framebuffer.flags.reset = true;
    }
    bVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::empty
                      ((vector<const_char_*,_std::allocator<const_char_*>_> *)&g_sphere.shading);
    if (!bVar1) {
      ppcVar2 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                          ((vector<const_char_*,_std::allocator<const_char_*>_> *)&g_sphere.shading,
                           0);
      sVar3 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                        ((vector<const_char_*,_std::allocator<const_char_*>_> *)&g_sphere.shading);
      bVar1 = ImGui::Combo("Merl",&g_sphere.shading.merl.id,ppcVar2,(int)sVar3,-1);
      if (bVar1) {
        loadMerlTexture();
        loadSphereProgram();
        g_framebuffer.flags.reset = true;
      }
    }
    bVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::empty
                      (&g_sphere.shading.envmap.files);
    if (!bVar1) {
      ppcVar2 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                          (&g_sphere.shading.envmap.files,0);
      sVar3 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                        (&g_sphere.shading.envmap.files);
      bVar1 = ImGui::Combo("Envmap",&g_sphere.shading.envmap.id,ppcVar2,(int)sVar3,-1);
      if (bVar1) {
        loadEnvmapTexture();
        loadSphereProgram();
        g_framebuffer.flags.reset = true;
      }
    }
    bVar1 = ImGui::CollapsingHeader("Flags",0x20);
    if ((bVar1) && (bVar1 = ImGui::Checkbox("Wireframe",(bool *)&g_sphere), bVar1)) {
      g_framebuffer.flags.reset = true;
    }
    bVar1 = ImGui::CollapsingHeader("Geometry",0x20);
    if (bVar1) {
      bVar1 = ImGui::SliderInt("xTess",&g_sphere.sphere.xTess,0,0x80,"%d");
      if (bVar1) {
        loadSphereMeshBuffers();
        loadSphereVertexArray();
        g_framebuffer.flags.reset = true;
      }
      bVar1 = ImGui::SliderInt("yTess",&g_sphere.sphere.yTess,0,0x80,"%d");
      if (bVar1) {
        loadSphereMeshBuffers();
        loadSphereVertexArray();
        g_framebuffer.flags.reset = true;
      }
    }
    ImGui::End();
    ImGui::Render();
    draw_data = ImGui::GetDrawData();
    ImGui_ImplGlfwGL3_RenderDrawData(draw_data);
  }
  if (g_app.recorder.on != 0) {
    (*glad_glBindFramebuffer)(0x8ca8,g_gl.framebuffers[0]);
    sprintf(path + 0x3f8,"capture_%02i_%09i",(ulong)(uint)g_app.recorder.capture,
            (ulong)(uint)g_app.recorder.frame);
    strcat2(local_948,g_app.dir.output,path + 0x3f8);
    djgt_save_glcolorbuffer_bmp(0x8ce0,0x1907,local_948);
    g_app.recorder.frame = g_app.recorder.frame + 1;
  }
  (*glad_glBindFramebuffer)(0x8ca9,0);
  (*glad_glBindFramebuffer)(0x8ca8,0);
  return;
}

Assistant:

void renderViewer(double cpuDt, double gpuDt)
{
    glBindFramebuffer(GL_DRAW_FRAMEBUFFER, g_gl.framebuffers[FRAMEBUFFER_BACK]);
    glBindFramebuffer(GL_READ_FRAMEBUFFER, g_gl.framebuffers[FRAMEBUFFER_SCENE]);
    glViewport(0, 0, g_app.viewer.w, g_app.viewer.h);
    glClearColor(0, 0, 0, 0);
    glClear(GL_COLOR_BUFFER_BIT);

    // post process the scene framebuffer
    glUseProgram(g_gl.programs[PROGRAM_VIEWER]);
    glBindVertexArray(g_gl.vertexArrays[VERTEXARRAY_EMPTY]);
    glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

    // draw HUD
    if (g_app.viewer.hud) {
        // ImGui
        ImGui_ImplGlfwGL3_NewFrame();
        // Viewer Widgets
        ImGui::SetNextWindowPos(ImVec2(270, 10)/*, ImGuiSetCond_FirstUseEver*/);
        ImGui::SetNextWindowSize(ImVec2(250, 120)/*, ImGuiSetCond_FirstUseEver*/);
        ImGui::Begin("Framebuffer");
        {
            const char* aaItems[] = {
                "None",
                "MSAA x2",
                "MSAA x4",
                "MSAA x8",
                "MSAA x16"
            };
            if (ImGui::Combo("AA", &g_framebuffer.aa, aaItems, BUFFER_SIZE(aaItems)))
                imguiSetAa();
            if (ImGui::Combo("MSAA", &g_framebuffer.msaa.fixed, "Fixed\0Random\0\0"))
                imguiSetAa();
            ImGui::Checkbox("Progressive", &g_framebuffer.flags.progressive);
            if (g_framebuffer.flags.progressive) {
                ImGui::SameLine();
                if (ImGui::Button("Reset"))
                    g_framebuffer.flags.reset = true;
            }
        }
        ImGui::End();
        // Framebuffer Widgets
        ImGui::SetNextWindowPos(ImVec2(530, 10)/*, ImGuiSetCond_FirstUseEver*/);
        ImGui::SetNextWindowSize(ImVec2(250, 120)/*, ImGuiSetCond_FirstUseEver*/);
        ImGui::Begin("Viewer");
        {
            if (ImGui::SliderFloat("Exposure", &g_app.viewer.exposure, -3.0f, 3.0f))
                configureViewerProgram();
            if (ImGui::SliderFloat("Gamma", &g_app.viewer.gamma, 1.0f, 4.0f))
                configureViewerProgram();
            if (ImGui::Button("Take Screenshot")) {
                static int cnt = 0;
                char buf[1024];

                snprintf(buf, 1024, "screenshot%03i", cnt);
                glBindFramebuffer(GL_READ_FRAMEBUFFER, 0);
                djgt_save_glcolorbuffer_png(GL_FRONT, GL_RGBA, buf);
                ++cnt;
            }
            if (ImGui::Button("Record"))
                g_app.recorder.on = !g_app.recorder.on;
            if (g_app.recorder.on) {
                ImGui::SameLine();
                ImGui::Text("Recording...");
            }
        }
        ImGui::End();
        // Camera Widgets
        ImGui::SetNextWindowPos(ImVec2(10, 10)/*, ImGuiSetCond_FirstUseEver*/);
        ImGui::SetNextWindowSize(ImVec2(250, 120)/*, ImGuiSetCond_FirstUseEver*/);
        ImGui::Begin("Camera");
        {
            if (ImGui::SliderFloat("FOVY", &g_camera.fovy, 1.0f, 179.0f))
                g_framebuffer.flags.reset = true;
            if (ImGui::SliderFloat("zNear", &g_camera.zNear, 0.01f, 100.f)) {
                if (g_camera.zNear >= g_camera.zFar)
                    g_camera.zNear = g_camera.zFar - 0.01f;
            }
            if (ImGui::SliderFloat("zFar", &g_camera.zFar, 1.f, 1500.f)) {
                if (g_camera.zFar <= g_camera.zNear)
                    g_camera.zFar = g_camera.zNear + 0.01f;
            }
        }
        ImGui::End();
        // Lighting/Planets Widgets
        ImGui::SetNextWindowPos(ImVec2(10, 140)/*, ImGuiSetCond_FirstUseEver*/);
        ImGui::SetNextWindowSize(ImVec2(250, 450)/*, ImGuiSetCond_FirstUseEver*/);
        ImGui::Begin("Sphere");
        {
            const char* shadingModes[] = {
                "MC Cos",
                "MC GGX",
                "MC MIS",
                "Debug"
            };
            const char* brdfModes[] = {
                "diffuse",
                "merl",
                "npf"
            };
            if (ImGui::Combo("Shading", &g_sphere.shading.mode, shadingModes, BUFFER_SIZE(shadingModes))) {
                loadSphereProgram();
                loadMerlTexture();
                g_framebuffer.flags.reset = true;
            }
            if (ImGui::Combo("Brdf", &g_sphere.shading.brdf, brdfModes, BUFFER_SIZE(brdfModes))) {
                loadSphereProgram();
                g_framebuffer.flags.reset = true;
            }
            if (!g_sphere.shading.merl.files.empty()) {
                if (ImGui::Combo("Merl", &g_sphere.shading.merl.id, &g_sphere.shading.merl.files[0], g_sphere.shading.merl.files.size())) {
                    loadMerlTexture();
                    loadSphereProgram();
                    g_framebuffer.flags.reset = true;
                }
            }
            if (!g_sphere.shading.envmap.files.empty()) {
                if (ImGui::Combo("Envmap", &g_sphere.shading.envmap.id, &g_sphere.shading.envmap.files[0], g_sphere.shading.envmap.files.size())) {
                    loadEnvmapTexture();
                    loadSphereProgram();
                    g_framebuffer.flags.reset = true;
                }
            }
            if (ImGui::CollapsingHeader("Flags", ImGuiTreeNodeFlags_DefaultOpen)) {
                if (ImGui::Checkbox("Wireframe", &g_sphere.flags.showLines))
                    g_framebuffer.flags.reset = true;
            }
            if (ImGui::CollapsingHeader("Geometry", ImGuiTreeNodeFlags_DefaultOpen)) {
                if (ImGui::SliderInt("xTess", &g_sphere.sphere.xTess, 0, 128)) {
                    loadSphereMeshBuffers();
                    loadSphereVertexArray();
                    g_framebuffer.flags.reset = true;
                }
                if (ImGui::SliderInt("yTess", &g_sphere.sphere.yTess, 0, 128)) {
                    loadSphereMeshBuffers();
                    loadSphereVertexArray();
                    g_framebuffer.flags.reset = true;
                }
            }
        }
        ImGui::End();

        ImGui::Render();
        ImGui_ImplGlfwGL3_RenderDrawData(ImGui::GetDrawData());
    }

    // screen recording
    if (g_app.recorder.on) {
        char name[64], path[1024];

        glBindFramebuffer(GL_READ_FRAMEBUFFER, g_gl.framebuffers[FRAMEBUFFER_BACK]);
        sprintf(name, "capture_%02i_%09i",
                g_app.recorder.capture,
                g_app.recorder.frame);
        strcat2(path, g_app.dir.output, name);
        djgt_save_glcolorbuffer_bmp(GL_COLOR_ATTACHMENT0, GL_RGB, path);
        ++g_app.recorder.frame;
    }

    // restore state
    glBindFramebuffer(GL_DRAW_FRAMEBUFFER, 0);
    glBindFramebuffer(GL_READ_FRAMEBUFFER, 0);
}